

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O2

void __thiscall Alice::Alice(Alice *this)

{
  Server *this_00;
  string local_48;
  allocator local_21;
  
  (this->super_Party).pc = 0;
  (this->super_Party).output = 0;
  (this->super_Party).n_p = 0;
  (this->super_Party).n_d = 0;
  (this->super_Party).rc = 0;
  (this->super_Party).alpha_rc = 0;
  (this->super_Party).termination_condition = false;
  (this->super_Party).trace = false;
  memset(&(this->super_Party).P,0,0xf0);
  (this->Pi_P_diff_R_PB_R_PA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Pi_P_diff_R_PB_R_PA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Pi_P_diff_R_PB_R_PA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Pi_D_diff_R_DB_R_DA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Pi_D_diff_R_DB_R_DA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Pi_D_diff_R_DB_R_DA).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LoadProgramShare(this);
  LoadDataShare(this);
  LoadCorrelatedRandoms(this);
  LoadAlphaRandoms(this);
  LoadNextRandomPermutation(this);
  LoadNextShuffleVectors(this);
  this_00 = (Server *)operator_new(0x180);
  std::__cxx11::string::string((string *)&local_48,"Alice",&local_21);
  Server::Server(this_00,&local_48);
  this->srv = this_00;
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

Alice::Alice()
{
    LoadProgramShare();
    LoadDataShare();
    LoadCorrelatedRandoms();
    LoadAlphaRandoms();
    LoadNextRandomPermutation();
    LoadNextShuffleVectors();  
    srv = new Server("Alice");    
}